

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O0

int cfg_tobin_strptr(void *reference,size_t bin_size,const_strarray *value)

{
  char *pcVar1;
  char **ptr;
  const_strarray *value_local;
  size_t bin_size_local;
  void *reference_local;
  
  if (bin_size == 8) {
    if (*reference != 0) {
      free(*reference);
    }
    pcVar1 = strdup(value->value);
    *(char **)reference = pcVar1;
    reference_local._4_4_ = 0;
    if (*reference == 0) {
      reference_local._4_4_ = -1;
    }
  }
  else {
    reference_local._4_4_ = -1;
  }
  return reference_local._4_4_;
}

Assistant:

int
cfg_tobin_strptr(void *reference, size_t bin_size, const struct const_strarray *value) {
  char **ptr;

  if (bin_size != sizeof(*ptr)) {
    return -1;
  }

  ptr = (char **)reference;
  if (*ptr) {
    free(*ptr);
  }

  *ptr = strdup(strarray_get_first_c(value));
  return *ptr == NULL ? -1 : 0;
}